

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

CONF_SECTION * NCONF_new_section(CONF *conf,char *section)

{
  int iVar1;
  char *pcVar2;
  stack_st_CONF_VALUE *psVar3;
  CONF_SECTION *local_30;
  CONF_SECTION *old_section;
  CONF_SECTION *s;
  char *section_local;
  CONF *conf_local;
  
  s = (CONF_SECTION *)section;
  section_local = (char *)conf;
  old_section = (CONF_SECTION *)OPENSSL_malloc(0x10);
  if (old_section == (CONF_SECTION *)0x0) {
    conf_local = (CONF *)0x0;
  }
  else {
    pcVar2 = OPENSSL_strdup((char *)s);
    old_section->name = pcVar2;
    psVar3 = sk_CONF_VALUE_new_null();
    old_section->values = psVar3;
    if (((old_section->name == (char *)0x0) || (old_section->values == (stack_st_CONF_VALUE *)0x0))
       || (iVar1 = lh_CONF_SECTION_insert
                             (*(lhash_st_CONF_SECTION **)(section_local + 8),&local_30,old_section),
          iVar1 == 0)) {
      section_free(old_section);
      conf_local = (CONF *)0x0;
    }
    else {
      section_free(local_30);
      conf_local = (CONF *)old_section;
    }
  }
  return (CONF_SECTION *)conf_local;
}

Assistant:

static CONF_SECTION *NCONF_new_section(const CONF *conf, const char *section) {
  CONF_SECTION *s =
      reinterpret_cast<CONF_SECTION *>(OPENSSL_malloc(sizeof(CONF_SECTION)));
  if (!s) {
    return NULL;
  }
  s->name = OPENSSL_strdup(section);
  s->values = sk_CONF_VALUE_new_null();
  if (s->name == NULL || s->values == NULL) {
    goto err;
  }

  CONF_SECTION *old_section;
  if (!lh_CONF_SECTION_insert(conf->sections, &old_section, s)) {
    goto err;
  }
  section_free(old_section);
  return s;

err:
  section_free(s);
  return NULL;
}